

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O3

bool __thiscall Kernel::Clause::isPropositional(Clause *this)

{
  Literal *pLVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Literal **ppLVar5;
  
  uVar2 = *(uint *)&this->field_0x38 & 0xfffff;
  ppLVar5 = this->_literals;
  uVar3 = 0xffffffff;
  do {
    uVar4 = uVar2;
    if (uVar3 - uVar2 == -1) break;
    pLVar1 = *ppLVar5;
    ppLVar5 = ppLVar5 + 1;
    uVar3 = uVar3 + 1;
    uVar4 = uVar3;
  } while ((*(uint *)&(pLVar1->super_Term).field_0xc & 0xfffffff) == 0);
  return uVar2 <= uVar4;
}

Assistant:

bool Clause::isPropositional()
{
  return iterLits().all([](auto l) { return l->arity() == 0; });
}